

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O2

Type * __thiscall
slang::ast::SimpleSystemSubroutine::checkArguments
          (SimpleSystemSubroutine *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  bool bVar2;
  Type **ppTVar3;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar2 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,this->isMethod,args,range,
                     this->requiredArgs,
                     (long)(this->argTypes).
                           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->argTypes).
                           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (bVar2) {
    if ((this->isFirstArgLValue == true) && ((args->_M_extent)._M_extent_value != 0)) {
      bVar2 = SystemSubroutine::registerLValue(*args->_M_ptr,context);
      if (!bVar2) goto LAB_003edeea;
    }
    ppTVar3 = &this->returnType;
  }
  else {
LAB_003edeea:
    ppTVar3 = &pCVar1->errorType;
  }
  return *ppTVar3;
}

Assistant:

const Type& SimpleSystemSubroutine::checkArguments(const ASTContext& context, const Args& args,
                                                   SourceRange range, const Expression*) const {
    auto& comp = context.getCompilation();
    if (!checkArgCount(context, isMethod, args, range, requiredArgs, argTypes.size()))
        return comp.getErrorType();

    if (isFirstArgLValue && !args.empty() && !registerLValue(*args[0], context))
        return comp.getErrorType();

    return *returnType;
}